

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

thousands_sep_result<char> * fmt::v11::detail::thousands_sep_impl<char>(locale_ref loc)

{
  bool bVar1;
  numpunct *pnVar2;
  thousands_sep_result<char> *in_RDI;
  char thousands_sep;
  string grouping;
  numpunct<char> *facet;
  undefined6 in_stack_ffffffffffffff80;
  char in_stack_ffffffffffffff86;
  char cVar3;
  char cVar4;
  thousands_sep_result<char> *ptVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  locale local_20 [8];
  numpunct *local_18;
  
  ptVar5 = in_RDI;
  locale_ref::get<std::locale>((locale_ref *)in_RDI);
  pnVar2 = std::use_facet<std::__cxx11::numpunct<char>>(local_20);
  std::locale::~locale(local_20);
  local_18 = pnVar2;
  std::__cxx11::numpunct<char>::grouping();
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x25d603);
  if (bVar1) {
    cVar3 = '\0';
  }
  else {
    in_stack_ffffffffffffff86 = std::__cxx11::numpunct<char>::thousands_sep();
    cVar3 = in_stack_ffffffffffffff86;
  }
  cVar4 = cVar3;
  std::__cxx11::string::string(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  ptVar5->thousands_sep = cVar3;
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(cVar4,CONCAT16(in_stack_ffffffffffffff86,in_stack_ffffffffffffff80)));
  return in_RDI;
}

Assistant:

FMT_FUNC auto thousands_sep_impl(locale_ref loc) -> thousands_sep_result<Char> {
  auto&& facet = use_facet<numpunct<Char>>(loc.get<locale>());
  auto grouping = facet.grouping();
  auto thousands_sep = grouping.empty() ? Char() : facet.thousands_sep();
  return {std::move(grouping), thousands_sep};
}